

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_kernel_bmod.h
# Opt level: O2

void Eigen::internal::LU_kernel_bmod<1>::
     run<Eigen::VectorBlock<Eigen::Matrix<double,_1,1,0,_1,1>,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>,int>
               (int param_1,VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *dense,
               Matrix<double,__1,_1,_0,__1,_1> *param_3,Matrix<double,__1,_1,_0,__1,_1> *lusup,
               int *luptr,int lda,int nrow,Matrix<int,__1,_1,_0,__1,_1> *lsub,int lptr,int no_zeros)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  PointerType pdVar6;
  long lVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  
  lVar7 = (long)lptr;
  lVar12 = (long)no_zeros;
  pSVar8 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)lsub,
                      (long)(lptr + no_zeros));
  pSVar9 = DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
           operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                       *)dense,(long)*pSVar8);
  iVar10 = *luptr + (lda + 1) * no_zeros + 1;
  dVar13 = *pSVar9;
  *luptr = iVar10;
  pdVar4 = (lusup->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  piVar5 = (lsub->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar6 = (dense->super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>).
           super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
           m_data;
  dVar13 = -dVar13;
  for (lVar11 = 0; (int)lVar11 + 1 < nrow; lVar11 = lVar11 + 2) {
    iVar3 = piVar5[lVar7 + lVar12 + lVar11 + 2];
    dVar1 = pdVar4[(long)iVar10 + lVar11 + 1];
    dVar2 = pdVar6[iVar3];
    pdVar6[piVar5[lVar7 + lVar12 + lVar11 + 1]] =
         pdVar4[iVar10 + lVar11] * dVar13 + pdVar6[piVar5[lVar7 + lVar12 + lVar11 + 1]];
    pdVar6[iVar3] = dVar1 * dVar13 + dVar2;
  }
  if ((int)lVar11 < nrow) {
    pdVar6[piVar5[lVar7 + lVar12 + lVar11 + 1]] =
         dVar13 * pdVar4[iVar10 + lVar11] + pdVar6[piVar5[lVar7 + lVar12 + lVar11 + 1]];
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void LU_kernel_bmod<1>::run(const int /*segsize*/, BlockScalarVector& dense, ScalarVector& /*tempv*/, ScalarVector& lusup, Index& luptr,
                                              const Index lda, const Index nrow, IndexVector& lsub, const Index lptr, const Index no_zeros)
{
  typedef typename ScalarVector::Scalar Scalar;
  Scalar f = dense(lsub(lptr + no_zeros));
  luptr += lda * no_zeros + no_zeros + 1;
  const Scalar* a(lusup.data() + luptr);
  const /*typename IndexVector::Scalar*/Index*  irow(lsub.data()+lptr + no_zeros + 1);
  Index i = 0;
  for (; i+1 < nrow; i+=2)
  {
    Index i0 = *(irow++);
    Index i1 = *(irow++);
    Scalar a0 = *(a++);
    Scalar a1 = *(a++);
    Scalar d0 = dense.coeff(i0);
    Scalar d1 = dense.coeff(i1);
    d0 -= f*a0;
    d1 -= f*a1;
    dense.coeffRef(i0) = d0;
    dense.coeffRef(i1) = d1;
  }
  if(i<nrow)
    dense.coeffRef(*(irow++)) -= f * *(a++);
}